

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

OperatorResultType
duckdb::RangeFunction<false>
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  hugeint_t *start;
  hugeint_t *end_00;
  _func_int **idx;
  hugeint_t input_00;
  int64_t start_00;
  bool bVar1;
  LocalTableFunctionState *pLVar2;
  hugeint_t *increment_00;
  reference pvVar3;
  ulong value_count;
  unsigned_long uVar4;
  long increment_01;
  InternalException *this;
  BinderException *this_00;
  pointer pVVar5;
  pointer pVVar6;
  ulong uVar7;
  idx_t count;
  hugeint_t hVar8;
  hugeint_t increment;
  hugeint_t current_value;
  int64_t current_value_i64;
  hugeint_t local_88;
  hugeint_t end;
  hugeint_t local_60;
  hugeint_t local_50;
  hugeint_t local_40;
  
  pLVar2 = optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->(&data_p->local_state);
  start = (hugeint_t *)(pLVar2 + 4);
  end_00 = (hugeint_t *)(pLVar2 + 6);
  increment_00 = (hugeint_t *)(pLVar2 + 8);
  if (((ulong)pLVar2[1]._vptr_LocalTableFunctionState & 1) != 0) goto LAB_00884973;
LAB_008847d8:
  idx = pLVar2[2]._vptr_LocalTableFunctionState;
  if ((_func_int **)input->count <= idx) {
    pLVar2[2]._vptr_LocalTableFunctionState = (_func_int **)0x0;
    *(undefined1 *)&pLVar2[1]._vptr_LocalTableFunctionState = 0;
    return NEED_MORE_INPUT;
  }
  DataChunk::Flatten(input);
  uVar7 = 0;
LAB_008847f5:
  pVVar6 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar5 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (uVar7 < (ulong)(((long)pVVar5 - (long)pVVar6) / 0x68)) goto code_r0x0088480c;
  uVar7 = 0;
  while( true ) {
    value_count = ((long)pVVar5 - (long)pVVar6) / 0x68;
    if (value_count <= uVar7) break;
    if (uVar7 == 3) {
      this = (InternalException *)
             __cxa_allocate_exception(0x10,pVVar6,((long)pVVar5 - (long)pVVar6) % 0x68);
      ::std::__cxx11::string::string
                ((string *)&increment,"Unsupported parameter count for range function",
                 (allocator *)&current_value);
      InternalException::InternalException(this,(string *)&increment);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&input->data,uVar7);
    (&end.lower)[uVar7] = *(uint64_t *)(pvVar3->data + (long)idx * 8);
    uVar7 = uVar7 + 1;
    pVVar6 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar5 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  GetParameters((int64_t *)&end,value_count,start,end_00,increment_00);
  hugeint_t::hugeint_t(&increment,0);
  bVar1 = hugeint_t::operator==(increment_00,&increment);
  if (bVar1) {
    this_00 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&increment,"interval cannot be 0!",(allocator *)&current_value);
    BinderException::BinderException(this_00,(string *)&increment);
    __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = hugeint_t::operator>(start,end_00);
  if (bVar1) {
    hugeint_t::hugeint_t(&increment,0);
    bVar1 = hugeint_t::operator>(increment_00,&increment);
    if (bVar1) {
      *(undefined1 *)&pLVar2[10]._vptr_LocalTableFunctionState = 1;
    }
  }
  bVar1 = hugeint_t::operator<(start,end_00);
  if (bVar1) {
    hugeint_t::hugeint_t(&increment,0);
    bVar1 = hugeint_t::operator<(increment_00,&increment);
    if (bVar1) {
      *(undefined1 *)&pLVar2[10]._vptr_LocalTableFunctionState = 1;
    }
  }
  goto LAB_0088496a;
code_r0x0088480c:
  pvVar3 = vector<duckdb::Vector,_true>::get<true>(&input->data,uVar7);
  bVar1 = FlatVector::IsNull(pvVar3,(idx_t)idx);
  uVar7 = uVar7 + 1;
  if (bVar1) goto code_r0x00884829;
  goto LAB_008847f5;
code_r0x00884829:
  hugeint_t::hugeint_t(&increment,0);
  start->lower = increment.lower;
  pLVar2[5]._vptr_LocalTableFunctionState = (_func_int **)increment.upper;
  hugeint_t::hugeint_t(&increment,0);
  end_00->lower = increment.lower;
  pLVar2[7]._vptr_LocalTableFunctionState = (_func_int **)increment.upper;
  hugeint_t::hugeint_t(&increment,1);
  increment_00->lower = increment.lower;
  pLVar2[9]._vptr_LocalTableFunctionState = (_func_int **)increment.upper;
LAB_0088496a:
  *(undefined1 *)&pLVar2[1]._vptr_LocalTableFunctionState = 1;
  pLVar2[3]._vptr_LocalTableFunctionState = (_func_int **)0x0;
LAB_00884973:
  if (*(char *)&pLVar2[10]._vptr_LocalTableFunctionState == '\x01') {
    output->count = 0;
    pLVar2[2]._vptr_LocalTableFunctionState =
         (_func_int **)((long)pLVar2[2]._vptr_LocalTableFunctionState + 1);
    *(undefined1 *)&pLVar2[1]._vptr_LocalTableFunctionState = 0;
  }
  else {
    increment.lower = increment_00->lower;
    increment.upper = (int64_t)pLVar2[9]._vptr_LocalTableFunctionState;
    end.lower = end_00->lower;
    end.upper = (int64_t)pLVar2[7]._vptr_LocalTableFunctionState;
    hugeint_t::hugeint_t(&local_60,(int64_t)pLVar2[3]._vptr_LocalTableFunctionState);
    local_88 = hugeint_t::operator*(&increment,&local_60);
    current_value = hugeint_t::operator+(start,&local_88);
    hVar8.upper = (int64_t)&current_value_i64;
    hVar8.lower = current_value.upper;
    bVar1 = Hugeint::TryCast<long>((Hugeint *)current_value.lower,hVar8,&current_value_i64);
    if (!bVar1) {
      pLVar2[2]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar2[2]._vptr_LocalTableFunctionState + 1);
      *(undefined1 *)&pLVar2[1]._vptr_LocalTableFunctionState = 0;
      goto LAB_008847d8;
    }
    hugeint_t::hugeint_t(&local_88,0);
    bVar1 = hugeint_t::operator<(&increment,&local_88);
    local_60 = hugeint_t::operator-(&end,&current_value);
    hugeint_t::hugeint_t(&local_50,(ulong)bVar1 - 1 | 1);
    local_40 = hugeint_t::operator+(&increment,&local_50);
    local_88 = hugeint_t::operator+(&local_60,&local_40);
    hVar8 = hugeint_t::operator/(&local_88,&increment);
    uVar4 = Hugeint::Cast<unsigned_long>(hVar8);
    count = 0x800;
    if (uVar4 < 0x800) {
      count = uVar4;
    }
    pvVar3 = vector<duckdb::Vector,_true>::get<true>(&output->data,0);
    start_00 = current_value_i64;
    input_00.upper = increment.upper;
    input_00.lower = increment.lower;
    increment_01 = Hugeint::Cast<long>(input_00);
    Vector::Sequence(pvVar3,start_00,increment_01,count);
    pLVar2[3]._vptr_LocalTableFunctionState =
         (_func_int **)((long)pLVar2[3]._vptr_LocalTableFunctionState + count);
    output->count = count;
    if (uVar4 == 0) {
      pLVar2[2]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar2[2]._vptr_LocalTableFunctionState + 1);
      *(undefined1 *)&pLVar2[1]._vptr_LocalTableFunctionState = 0;
      goto LAB_008847d8;
    }
  }
  return HAVE_MORE_OUTPUT;
}

Assistant:

static OperatorResultType RangeFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                        DataChunk &output) {
	auto &state = data_p.local_state->Cast<RangeFunctionLocalState>();
	while (true) {
		if (!state.initialized_row) {
			// initialize for the current input row
			if (state.current_input_row >= input.size()) {
				// ran out of rows
				state.current_input_row = 0;
				state.initialized_row = false;
				return OperatorResultType::NEED_MORE_INPUT;
			}
			GenerateRangeParameters<GENERATE_SERIES>(input, state.current_input_row, state);
			state.initialized_row = true;
			state.current_idx = 0;
		}
		if (state.empty_range) {
			// empty range
			output.SetCardinality(0);
			state.current_input_row++;
			state.initialized_row = false;
			return OperatorResultType::HAVE_MORE_OUTPUT;
		}
		auto increment = state.increment;
		auto end = state.end;
		hugeint_t current_value = state.start + increment * UnsafeNumericCast<int64_t>(state.current_idx);
		int64_t current_value_i64;
		if (!Hugeint::TryCast<int64_t>(current_value, current_value_i64)) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		int64_t offset = increment < 0 ? 1 : -1;
		idx_t remaining = MinValue<idx_t>(
		    Hugeint::Cast<idx_t>((end - current_value + (increment + offset)) / increment), STANDARD_VECTOR_SIZE);
		// set the result vector as a sequence vector
		output.data[0].Sequence(current_value_i64, Hugeint::Cast<int64_t>(increment), remaining);
		// increment the index pointer by the remaining count
		state.current_idx += remaining;
		output.SetCardinality(remaining);
		if (remaining == 0) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		return OperatorResultType::HAVE_MORE_OUTPUT;
	}
}